

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_imu-elastic-local-frame-dynamical-system.cpp
# Opt level: O1

double rotationMatrixFromContactsPositionKine(Vector3 *vLFootPos,Vector3 *vRFootPos,Matrix3 *R)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *pCVar5;
  undefined4 uVar6;
  undefined4 extraout_XMM0_Dc;
  undefined4 uVar7;
  undefined4 extraout_XMM0_Dd;
  double dVar8;
  undefined1 auVar9 [16];
  double local_a8;
  double local_98;
  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> local_88;
  undefined1 local_68 [16];
  double local_50;
  double local_48;
  double local_40;
  Scalar local_38;
  double local_30;
  double local_28;
  double local_20;
  double local_18;
  
  dVar8 = (vLFootPos->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data
          .array[2] -
          (vRFootPos->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data
          .array[2];
  auVar9._0_8_ = (vLFootPos->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
                 .m_data.array[0] -
                 (vRFootPos->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
                 .m_data.array[0];
  auVar9._8_8_ = (vLFootPos->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
                 .m_data.array[1] -
                 (vRFootPos->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
                 .m_data.array[1];
  uVar6 = 0;
  uVar7 = 0;
  dVar1 = dVar8 * dVar8 + auVar9._8_8_ * auVar9._8_8_ + auVar9._0_8_ * auVar9._0_8_;
  if (dVar1 <= 9.999999999999999e-33) {
    local_68 = ZEXT816(0);
    auVar9 = ZEXT816(0);
    dVar8 = 1.0;
  }
  else {
    if (dVar1 < 0.0) {
      dVar1 = sqrt(dVar1);
      uVar6 = extraout_XMM0_Dc;
      uVar7 = extraout_XMM0_Dd;
    }
    else {
      dVar1 = SQRT(dVar1);
    }
    auVar4._8_8_ = dVar1;
    auVar4._0_8_ = dVar1;
    auVar9 = divpd(auVar9,auVar4);
    local_68._8_4_ = uVar6;
    local_68._0_8_ = dVar1;
    local_68._12_4_ = uVar7;
    dVar8 = dVar8 / dVar1;
  }
  atan2(auVar9._8_8_,dVar8);
  local_a8 = auVar9._0_8_;
  dVar1 = atan2(local_a8,dVar8);
  dVar8 = atan2(local_a8,auVar9._8_8_);
  dVar2 = cos(dVar1);
  dVar3 = cos(dVar8);
  local_88.m_row = 0;
  local_88.m_col = 1;
  local_88.m_currentBlockRows = 1;
  (R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0] =
       dVar3 * dVar2;
  local_88.m_xpr = R;
  local_98 = cos(dVar1);
  local_98 = -local_98;
  local_18 = sin(dVar8);
  local_18 = local_18 * local_98;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (&local_88,&local_18);
  local_20 = sin(dVar1);
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar5,&local_20);
  local_28 = sin(dVar8);
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar5,&local_28);
  local_30 = cos(dVar8);
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar5,&local_30);
  local_38 = 0.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar5,&local_38);
  local_98 = sin(dVar1);
  local_98 = -local_98;
  local_40 = cos(dVar8);
  local_40 = local_40 * local_98;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar5,&local_40);
  dVar2 = sin(dVar1);
  local_48 = sin(dVar8);
  local_48 = local_48 * dVar2;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar5,&local_48);
  local_50 = cos(dVar1);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_(pCVar5,&local_50);
  if ((local_88.m_currentBlockRows + local_88.m_row == 3) && (local_88.m_col == 3)) {
    return (double)local_68._0_8_;
  }
  __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 3, 3>>::finished() [MatrixType = Eigen::Matrix<double, 3, 3>]"
               );
}

Assistant:

double rotationMatrixFromContactsPositionKine(const Vector3 vLFootPos, const Vector3 vRFootPos, Matrix3& R )
{
Vector3 Vrl, axis, theta;
AngleAxis j;
double h, thetax, thetay, thetaz;
// Definition of the length and the unit vector between the two foots.
Vrl=vLFootPos-vRFootPos;
j=kine::rotationVectorToAngleAxis(Vrl);
h = j.angle(); // length between the ankles
axis = j.axis(); // unit vector between the ankles
//Definition of the transformation (rotation) between (x,y,z) and (perpendicular of j, j, z).
thetax=atan2(axis[1],axis[2]);
//theta=theta(0,0,atan(axis[0]/axis[1]));
thetay = atan2(axis[0],axis[2]);//theta[1];
thetaz = atan2(axis[0],axis[1]);//theta[2];
R << cos(thetay)*cos(thetaz), -cos(thetay)*sin(thetaz), sin(thetay),
sin(thetaz), cos(thetaz), 0,
-sin(thetay)*cos(thetaz), sin(thetay)*sin(thetaz), cos(thetay);
return h;
}